

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdVerifyTxSign(void *handle,int net_type,char *tx_hex,char *txid,uint32_t vout,char *address,
                   int address_type,char *direct_locking_script,int64_t value_satoshi,
                   char *value_bytedata)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  uint32_t in_R8D;
  char *in_R9;
  char *in_stack_00000010;
  int64_t in_stack_00000018;
  char *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsConfidentialAddress confidential_addr;
  ElementsAddressFactory address_factory_1;
  AddressFactory address_factory;
  string addr;
  UtxoData utxo;
  bool is_bitcoin;
  OutPoint outpoint;
  Amount amount;
  AddressType addr_type;
  int result;
  UtxoData *in_stack_ffffffffffffe978;
  UtxoData *in_stack_ffffffffffffe980;
  AddressFactory *in_stack_ffffffffffffe988;
  string *in_stack_ffffffffffffe990;
  CfdError in_stack_ffffffffffffe99c;
  CfdException *in_stack_ffffffffffffe9a0;
  allocator_type *in_stack_ffffffffffffe9a8;
  string *tx_hex_00;
  ConfidentialTransactionContext *in_stack_ffffffffffffe9b0;
  iterator in_stack_ffffffffffffe9b8;
  ConfidentialTransactionContext *in_stack_ffffffffffffe9c0;
  bool *in_stack_ffffffffffffe9d8;
  undefined8 in_stack_ffffffffffffe9e0;
  int address_type_00;
  allocator *paVar3;
  UtxoData *in_stack_ffffffffffffe9f0;
  undefined8 ****ppppuVar4;
  UtxoData *in_stack_ffffffffffffe9f8;
  undefined8 ****ppppuVar5;
  UtxoData *in_stack_ffffffffffffea00;
  string local_1569;
  ConfidentialValue local_1548;
  undefined1 local_1519 [256];
  allocator local_1419;
  string local_1418 [224];
  undefined1 ****local_1338;
  undefined8 ***local_1330 [81];
  OutPoint *in_stack_ffffffffffffef58;
  ConfidentialTransactionContext *in_stack_ffffffffffffef60;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff058;
  ConfidentialTransactionContext *in_stack_fffffffffffff060;
  undefined1 ****local_e08;
  undefined8 local_e00;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_df8;
  allocator local_dd9;
  string local_dd8;
  Script local_db8;
  Script local_d80;
  Address local_d48;
  Address local_bc8;
  OutPoint *in_stack_fffffffffffff5b8;
  TransactionContext *in_stack_fffffffffffff5c0;
  Address local_868;
  allocator local_6b9;
  string local_6b8;
  Txid local_698;
  undefined8 local_678;
  Txid local_650;
  uint32_t local_630;
  Script local_628 [2];
  Address local_5b8;
  string local_438 [32];
  int64_t local_418;
  undefined1 local_410;
  AddressType local_408;
  undefined8 local_400;
  ConfidentialValue local_1d8 [3];
  byte local_14a;
  allocator local_149;
  string local_148;
  Txid local_128;
  OutPoint local_108;
  Amount local_e0;
  AddressType local_d0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  undefined4 local_3c;
  char *local_38;
  uint32_t local_2c;
  char *local_28;
  char *local_20;
  int local_4;
  
  address_type_00 = (int)((ulong)in_stack_ffffffffffffe9e0 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x8c0;
    local_68.funcname = "CfdVerifyTxSign";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe99c,in_stack_ffffffffffffe990);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x8c6;
    local_a8.funcname = "CfdVerifyTxSign";
    cfd::core::logger::warn<>(&local_a8,"txid is null or empty.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. txid is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe99c,in_stack_ffffffffffffe990);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0 = cfd::capi::ConvertAddressType(address_type_00);
  cfd::core::Amount::Amount(&local_e0,in_stack_00000018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,local_28,&local_149);
  cfd::core::Txid::Txid(&local_128,&local_148);
  cfd::core::OutPoint::OutPoint(&local_108,&local_128,local_2c);
  cfd::core::Txid::~Txid((Txid *)0x65246a);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_14a = 0;
  cfd::capi::ConvertNetType(address_type_00,in_stack_ffffffffffffe9d8);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe9f0);
  local_408 = 1;
  local_678 = 0;
  local_400 = 0;
  std::__cxx11::string::operator=(local_438,"");
  cfd::core::OutPoint::GetTxid(&local_698,&local_108);
  cfd::core::Txid::operator=(&local_650,&local_698);
  cfd::core::Txid::~Txid((Txid *)0x652525);
  local_630 = cfd::core::OutPoint::GetVout(&local_108);
  local_408 = local_d0;
  local_410 = local_e0.ignore_check_;
  local_418 = local_e0.amount_;
  bVar1 = cfd::capi::IsEmptyString(local_38);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_dd8,in_stack_00000010,&local_dd9);
      cfd::core::Script::Script(&local_db8,&local_dd8);
      cfd::core::Script::operator=(local_628,&local_db8);
      cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe980);
      std::__cxx11::string::~string((string *)&local_dd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b8,local_38,&local_6b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    if ((local_14a & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)in_stack_ffffffffffffe9b0);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_6b8);
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)&stack0xfffffffffffff5b8,&local_6b8);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  (&local_bc8,(ElementsConfidentialAddress *)&stack0xfffffffffffff5b8);
        cfd::core::Address::operator=(&local_5b8,&local_bc8);
        cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe980);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)in_stack_ffffffffffffe980);
      }
      else {
        cfd::AddressFactory::GetAddress
                  (in_stack_ffffffffffffe988,(string *)in_stack_ffffffffffffe980);
        cfd::core::Address::operator=(&local_5b8,&local_d48);
        cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe980);
      }
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x652918);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)0x652608);
      cfd::AddressFactory::GetAddress(in_stack_ffffffffffffe988,(string *)in_stack_ffffffffffffe980)
      ;
      cfd::core::Address::operator=(&local_5b8,&local_868);
      cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe980);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x65265a);
    }
    cfd::core::Address::GetLockingScript(&local_d80,&local_5b8);
    cfd::core::Script::operator=(local_628,&local_d80);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe980);
    std::__cxx11::string::~string((string *)&local_6b8);
  }
  local_1338 = (undefined1 ****)local_1330;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
  local_e08 = (undefined1 ****)local_1330;
  local_e00 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x652b29);
  __l._M_len = (size_type)in_stack_ffffffffffffe9c0;
  __l._M_array = in_stack_ffffffffffffe9b8;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffe9b0,__l,
             in_stack_ffffffffffffe9a8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x652b5d);
  ppppuVar4 = local_1330;
  ppppuVar5 = &local_e08;
  do {
    ppppuVar5 = ppppuVar5 + -0xa5;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffe980);
  } while (ppppuVar5 != ppppuVar4);
  if ((local_14a & 1) == 0) {
    tx_hex_00 = (string *)local_1519;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1519 + 1),local_20,(allocator *)tx_hex_00);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (in_stack_ffffffffffffe9b0,tx_hex_00);
    std::__cxx11::string::~string((string *)(local_1519 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1519);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000020);
    if (!bVar1) {
      in_stack_ffffffffffffe990 = &local_1569;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1569.field_0x1,in_stack_00000020,
                 (allocator *)in_stack_ffffffffffffe990);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1548,(string *)&local_1569.field_0x1);
      cfd::core::ConfidentialValue::operator=(local_1d8,&local_1548);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x652eb5);
      std::__cxx11::string::~string((string *)&local_1569.field_0x1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1569);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_df8,0);
      cfd::UtxoData::operator=(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
    }
    cfd::ConfidentialTransactionContext::GetTxInIndex
              (in_stack_ffffffffffffe9c0,(OutPoint *)in_stack_ffffffffffffe9b8);
    cfd::ConfidentialTransactionContext::CollectInputUtxo
              (in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    local_3c = 7;
    cfd::ConfidentialTransactionContext::Verify(in_stack_ffffffffffffef60,in_stack_ffffffffffffef58)
    ;
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_ffffffffffffe980);
  }
  else {
    paVar3 = &local_1419;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1418,local_20,paVar3);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)in_stack_ffffffffffffe980,(string *)in_stack_ffffffffffffe978);
    std::__cxx11::string::~string(local_1418);
    std::allocator<char>::~allocator((allocator<char> *)&local_1419);
    cfd::TransactionContext::GetTxInIndex
              ((TransactionContext *)in_stack_ffffffffffffe9c0,(OutPoint *)in_stack_ffffffffffffe9b8
              );
    cfd::TransactionContext::CollectInputUtxo
              ((TransactionContext *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    local_3c = 7;
    cfd::TransactionContext::Verify(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffe980);
  }
  local_4 = 0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffe990);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffe980);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x653062);
  return local_4;
}

Assistant:

int CfdVerifyTxSign(
    void* handle, int net_type, const char* tx_hex, const char* txid,
    uint32_t vout, const char* address, int address_type,
    const char* direct_locking_script, int64_t value_satoshi,
    const char* value_bytedata) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    AddressType addr_type = ConvertAddressType(address_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.descriptor = "";
    utxo.txid = outpoint.GetTxid();
    utxo.vout = outpoint.GetVout();
    utxo.address_type = addr_type;
    utxo.amount = amount;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (is_bitcoin) {
        AddressFactory address_factory;
        utxo.address = address_factory.GetAddress(addr);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          utxo.address = confidential_addr.GetUnblindedAddress();
        } else {
          utxo.address = address_factory.GetAddress(addr);
        }
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
      utxo.locking_script = utxo.address.GetLockingScript();
    } else if (!IsEmptyString(direct_locking_script)) {
      utxo.locking_script = Script(direct_locking_script);
    }
    std::vector<UtxoData> utxos = {utxo};

    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(value_bytedata)) {
        utxo.value_commitment = ConfidentialValue(value_bytedata);
        utxos[0] = utxo;
      }
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (result != CfdErrorCode::kCfdSignVerificationError) {
      result = SetLastError(handle, except);
    } else {
      SetLastError(handle, except);  // collect error message
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}